

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * lest::pluralise(text *__return_storage_ptr__,text *word,int n)

{
  int n_local;
  text *word_local;
  
  if (n == 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)word);
  }
  else {
    std::operator+(__return_storage_ptr__,word,"s");
  }
  return __return_storage_ptr__;
}

Assistant:

inline text pluralise( text word,int n )
{
    return n == 1 ? word : word + "s";
}